

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O3

uint aom_mse8x16_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  
  iVar27 = 0x10;
  iVar28 = 0;
  iVar30 = 0;
  iVar31 = 0;
  iVar32 = 0;
  do {
    uVar1 = *(ulong *)src;
    auVar3._8_6_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xe] = (char)(uVar1 >> 0x38);
    auVar5._8_4_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[0xc] = (char)(uVar1 >> 0x30);
    auVar5._13_2_ = auVar3._13_2_;
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar1;
    auVar7._12_3_ = auVar5._12_3_;
    auVar9._8_2_ = 0;
    auVar9._0_8_ = uVar1;
    auVar9[10] = (char)(uVar1 >> 0x28);
    auVar9._11_4_ = auVar7._11_4_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11._10_5_ = auVar9._10_5_;
    auVar13[8] = (char)(uVar1 >> 0x20);
    auVar13._0_8_ = uVar1;
    auVar13._9_6_ = auVar11._9_6_;
    auVar17._7_8_ = 0;
    auVar17._0_7_ = auVar13._8_7_;
    Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar23._9_6_ = 0;
    auVar23._0_9_ = Var18;
    auVar19._1_10_ = SUB1510(auVar23 << 0x30,5);
    auVar19[0] = (char)(uVar1 >> 0x10);
    auVar24._11_4_ = 0;
    auVar24._0_11_ = auVar19;
    auVar15[2] = (char)(uVar1 >> 8);
    auVar15._0_2_ = (ushort)uVar1;
    auVar15._3_12_ = SUB1512(auVar24 << 0x20,3);
    uVar2 = *(ulong *)ref;
    auVar4._8_6_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4[0xe] = (char)(uVar2 >> 0x38);
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar2;
    auVar6[0xc] = (char)(uVar2 >> 0x30);
    auVar6._13_2_ = auVar4._13_2_;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar2;
    auVar8._12_3_ = auVar6._12_3_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar2;
    auVar10[10] = (char)(uVar2 >> 0x28);
    auVar10._11_4_ = auVar8._11_4_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar2;
    auVar12._10_5_ = auVar10._10_5_;
    auVar14[8] = (char)(uVar2 >> 0x20);
    auVar14._0_8_ = uVar2;
    auVar14._9_6_ = auVar12._9_6_;
    auVar20._7_8_ = 0;
    auVar20._0_7_ = auVar14._8_7_;
    Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar25._9_6_ = 0;
    auVar25._0_9_ = Var21;
    auVar22._1_10_ = SUB1510(auVar25 << 0x30,5);
    auVar22[0] = (char)(uVar2 >> 0x10);
    auVar26._11_4_ = 0;
    auVar26._0_11_ = auVar22;
    auVar16[2] = (char)(uVar2 >> 8);
    auVar16._0_2_ = (ushort)uVar2;
    auVar16._3_12_ = SUB1512(auVar26 << 0x20,3);
    auVar33._0_2_ = ((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff);
    auVar33._2_2_ = auVar15._2_2_ - auVar16._2_2_;
    auVar33._4_2_ = auVar19._0_2_ - auVar22._0_2_;
    auVar33._6_2_ = (short)Var18 - (short)Var21;
    auVar33._8_2_ = auVar13._8_2_ - auVar14._8_2_;
    auVar33._10_2_ = auVar9._10_2_ - auVar10._10_2_;
    auVar33._12_2_ = auVar5._12_2_ - auVar6._12_2_;
    auVar33._14_2_ = (auVar3._13_2_ >> 8) - (auVar4._13_2_ >> 8);
    auVar33 = pmaddwd(auVar33,auVar33);
    iVar28 = iVar28 + auVar33._0_4_;
    iVar30 = iVar30 + auVar33._4_4_;
    iVar31 = iVar31 + auVar33._8_4_;
    iVar32 = iVar32 + auVar33._12_4_;
    src = (uint8_t *)((long)src + (long)src_stride);
    ref = (uint8_t *)((long)ref + (long)ref_stride);
    iVar27 = iVar27 + -1;
  } while (iVar27 != 0);
  uVar29 = iVar32 + iVar30 + iVar31 + iVar28;
  *sse = uVar29;
  return uVar29;
}

Assistant:

unsigned int aom_mse8x16_sse2(const uint8_t *src, int src_stride,
                              const uint8_t *ref, int ref_stride,
                              unsigned int *sse) {
  aom_variance8x16_sse2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}